

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_b_tree.cpp
# Opt level: O1

void __thiscall test_b_tree::test_remove_random_order(test_b_tree *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__filename;
  pointer plVar2;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __first;
  long lVar3;
  runtime_error *prVar4;
  value_type_conflict1 *__val;
  long lVar5;
  pointer plVar6;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> __last;
  optional<long> oVar7;
  vector<long,_std::allocator<long>_> keys;
  b_tree t;
  vector<long,_std::allocator<long>_> local_b8;
  string local_a0;
  b_tree local_80;
  
  paVar1 = &local_80._p._fileName.field_2;
  local_80._p._fileName._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_80,"test_remove_random_order.db","");
  b_tree::create_db_file((string *)&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._p._fileName._M_dataplus._M_p != paVar1) {
    operator_delete(local_80._p._fileName._M_dataplus._M_p,
                    local_80._p._fileName.field_2._M_allocated_capacity + 1);
  }
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"test_remove_random_order.db","");
  b_tree::b_tree(&local_80,&local_a0,4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  lVar5 = 800;
  __first._M_current = (long *)operator_new(800);
  __last._M_current = __first._M_current + 100;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = __first._M_current;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = __first._M_current;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = __last._M_current;
  memset(__first._M_current,0,800);
  lVar3 = 1;
  do {
    __first._M_current[lVar3 + -1] = lVar3;
    lVar3 = lVar3 + 1;
    lVar5 = lVar5 + -8;
  } while (lVar5 != 0);
  local_a0._M_dataplus._M_p = (pointer)0x1;
  local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish
       = __last._M_current;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            (__first,__last,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_a0);
  insert_all<b_tree>(&local_80,&local_b8);
  local_a0._M_dataplus._M_p = (pointer)0x1;
  std::
  shuffle<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>)
             local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> *)&local_a0);
  plVar2 = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    plVar6 = local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      __filename = (char *)*plVar6;
      oVar7 = b_tree::search(&local_80,(int64_t)__filename);
      if (((undefined1  [16])
           oVar7.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_a0,"%s at Line:%d File:%s","t.search(k)",0xb5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(prVar4,(string *)&local_a0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      b_tree::remove(&local_80,__filename);
      oVar7 = b_tree::search(&local_80,(int64_t)__filename);
      if (((undefined1  [16])
           oVar7.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long> & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
        rtf_format_abi_cxx11_
                  (&local_a0,"%s at Line:%d File:%s","!t.search(k)",0xb7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dicroce[P]tdb/ut/source/test_b_tree.cpp"
                  );
        std::runtime_error::runtime_error(prVar4,(string *)&local_a0);
        __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      plVar6 = plVar6 + 1;
    } while (plVar6 != plVar2);
  }
  unlink("test_remove_random_order.db");
  if (local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (long *)0x0) {
    operator_delete(local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  pager::~pager(&local_80._p);
  return;
}

Assistant:

void test_b_tree::test_large_number_of_keys()
{
    b_tree::create_db_file("test_large_number_of_keys.db");
    b_tree t("test_large_number_of_keys.db", 4);

    std::vector<int64_t> keys(10000);
    std::iota(begin(keys), end(keys), 1);
    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    insert_all(t, keys);

    RTF_ASSERT(has_all_keys(t, keys));

    std::shuffle(begin(keys), end(keys), std::default_random_engine{});

    for (auto k : keys) {
        t.remove(k);
    }

    for (auto k : keys) {
        RTF_ASSERT(!t.search(k));
    }

    unlink("test_large_number_of_keys.db");
}